

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddPubkeyHashSign
              (void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,
              char *pubkey,char *signature,bool use_der_encode,int sighash_type,
              bool sighash_anyone_can_pay,char **tx_string)

{
  bool bVar1;
  AddressType address_type;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_1e2;
  bool is_bitcoin;
  SigHashType sighashtype;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  OutPoint outpoint;
  TransactionContext tx;
  SigHashType local_c0;
  SigHashType local_b4;
  SignParameter param;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x668;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d52;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&param);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x66e;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d52;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. txid is null or empty.",(allocator *)&param);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x674;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d52;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"pubkey is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. pubkey is null or empty.",(allocator *)&param);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (!bVar1) {
    if (tx_string != (char **)0x0) {
      address_type = cfd::capi::ConvertHashToAddressType(hash_type);
      cfd::SignParameter::SignParameter(&param);
      if (use_der_encode) {
        cfd::core::SigHashType::Create
                  (&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
        std::__cxx11::string::string((string *)&tx,signature,(allocator *)&local_1b8);
        cfd::core::ByteData::ByteData((ByteData *)&outpoint,(string *)&tx);
        std::__cxx11::string::~string((string *)&tx);
        cfd::core::SigHashType::SigHashType(&local_b4,&sighashtype);
        cfd::SignParameter::SignParameter((SignParameter *)&tx,(ByteData *)&outpoint,true,&local_b4)
        ;
        cfd::SignParameter::operator=(&param,(SignParameter *)&tx);
        cfd::SignParameter::~SignParameter((SignParameter *)&tx);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint);
      }
      else {
        std::__cxx11::string::string((string *)&outpoint,signature,(allocator *)&sighashtype);
        cfd::core::SigHashType::SigHashType(&local_c0,kSigHashAll,false,false);
        cfd::SignParameter::SignParameter((SignParameter *)&tx,(string *)&outpoint,false,&local_c0);
        cfd::SignParameter::operator=(&param,(SignParameter *)&tx);
        cfd::SignParameter::~SignParameter((SignParameter *)&tx);
        std::__cxx11::string::~string((string *)&outpoint);
      }
      is_bitcoin = false;
      cfd::capi::ConvertNetType(net_type,&is_bitcoin);
      std::__cxx11::string::string((string *)&sighashtype,txid,(allocator *)&local_1b8);
      cfd::core::Txid::Txid((Txid *)&tx,(string *)&sighashtype);
      cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&tx,vout);
      cfd::core::Txid::~Txid((Txid *)&tx);
      std::__cxx11::string::~string((string *)&sighashtype);
      if (is_bitcoin == true) {
        std::__cxx11::string::string((string *)&sighashtype,tx_hex_string,(allocator *)&local_1b8);
        cfd::TransactionContext::TransactionContext(&tx,(string *)&sighashtype);
        std::__cxx11::string::~string((string *)&sighashtype);
        std::__cxx11::string::string((string *)&sighashtype,pubkey,&local_1e2);
        cfd::core::Pubkey::Pubkey((Pubkey *)&local_1b8,(string *)&sighashtype);
        cfd::TransactionContext::AddPubkeyHashSign
                  (&tx,&outpoint,&param,(Pubkey *)&local_1b8,address_type);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1b8);
        std::__cxx11::string::~string((string *)&sighashtype);
        cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                  ((string *)&sighashtype,(AbstractTransaction *)&tx);
        pcVar2 = cfd::capi::CreateString((string *)&sighashtype);
        *tx_string = pcVar2;
        std::__cxx11::string::~string((string *)&sighashtype);
        cfd::TransactionContext::~TransactionContext(&tx);
      }
      else {
        std::__cxx11::string::string((string *)&sighashtype,tx_hex_string,(allocator *)&local_1b8);
        cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                  ((ConfidentialTransactionContext *)&tx,(string *)&sighashtype);
        std::__cxx11::string::~string((string *)&sighashtype);
        std::__cxx11::string::string((string *)&sighashtype,pubkey,&local_1e2);
        cfd::core::Pubkey::Pubkey((Pubkey *)&local_1b8,(string *)&sighashtype);
        cfd::ConfidentialTransactionContext::AddPubkeyHashSign
                  ((ConfidentialTransactionContext *)&tx,&outpoint,&param,(Pubkey *)&local_1b8,
                   address_type);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1b8);
        std::__cxx11::string::~string((string *)&sighashtype);
        cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                  ((string *)&sighashtype,(AbstractTransaction *)&tx);
        pcVar2 = cfd::capi::CreateString((string *)&sighashtype);
        *tx_string = pcVar2;
        std::__cxx11::string::~string((string *)&sighashtype);
        cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                  ((ConfidentialTransactionContext *)&tx);
      }
      cfd::core::Txid::~Txid(&outpoint.txid_);
      cfd::SignParameter::~SignParameter(&param);
      return 0;
    }
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x680;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d52;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx output is null.",(allocator *)&param);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4fe2f6;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x67a;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7d52;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"signature is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. signature is null or empty.",(allocator *)&param);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddPubkeyHashSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey, const char* signature,
    bool use_der_encode, int sighash_type, bool sighash_anyone_can_pay,
    char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(signature));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(signature));
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}